

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printjava.cc
# Opt level: O0

bool PrintJava::isArrayType(Datatype *ct)

{
  bool bVar1;
  type_metatype tVar2;
  Datatype *this;
  Datatype *ct_local;
  
  tVar2 = Datatype::getMetatype(ct);
  if (tVar2 != TYPE_PTR) {
    return false;
  }
  this = TypePointer::getPtrTo((TypePointer *)ct);
  tVar2 = Datatype::getMetatype(this);
  if ((tVar2 - TYPE_PTR < 2) || (tVar2 == TYPE_BOOL)) {
LAB_006acc4c:
    ct_local._7_1_ = true;
  }
  else {
    if (tVar2 == TYPE_UINT) {
      bVar1 = Datatype::isCharPrint(this);
      if (bVar1) {
        return true;
      }
    }
    else if (tVar2 == TYPE_INT) goto LAB_006acc4c;
    ct_local._7_1_ = false;
  }
  return ct_local._7_1_;
}

Assistant:

bool PrintJava::isArrayType(const Datatype *ct)

{
  if (ct->getMetatype() != TYPE_PTR)	// Java arrays are always Ghidra pointer types
    return false;
  ct = ((TypePointer *)ct)->getPtrTo();
  switch(ct->getMetatype()) {
  case TYPE_UINT:     // Pointer to unsigned is placeholder for class reference, not an array
    if (ct->isCharPrint())
      return true;
    break;
  case TYPE_INT:
  case TYPE_BOOL:
  case TYPE_FLOAT:	// Pointer to primitive type is an array
  case TYPE_PTR:	// Pointer to class reference is an array
    return true;
  default:
    break;
  }
  return false;
}